

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

djg_mesh * djgm_load_torus(float aspect,int ring_segments,int pipe_segments)

{
  djgm_vertex *pdVar1;
  uint uVar2;
  djg_mesh *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pdVar3 = djgm_load_plane(ring_segments,pipe_segments);
  if (-2 < ring_segments) {
    uVar2 = pipe_segments + 2;
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    lVar7 = 0;
    uVar4 = 0;
    do {
      if (-2 < pipe_segments) {
        pdVar1 = pdVar3->vertexv;
        lVar6 = 0;
        do {
          fVar11 = *(float *)((long)&(pdVar1->st).s + lVar6 + lVar7);
          fVar10 = *(float *)((long)&(pdVar1->st).t + lVar6 + lVar7);
          fVar11 = (fVar11 + fVar11) * 3.1415927;
          fVar10 = (fVar10 + fVar10) * 3.1415927;
          fVar8 = cosf(fVar11);
          fVar8 = fVar8 * aspect + 1.0;
          fVar9 = cosf(fVar10);
          *(float *)((long)&(pdVar1->p).x + lVar6 + lVar7) = fVar9 * fVar8;
          fVar10 = sinf(fVar10);
          *(float *)((long)&(pdVar1->p).y + lVar6 + lVar7) = fVar10 * fVar8;
          fVar11 = sinf(fVar11);
          *(float *)((long)&(pdVar1->p).z + lVar6 + lVar7) = fVar11 * aspect;
          *(undefined8 *)((long)&(pdVar1->dpds).x + lVar6 + lVar7) = 0;
          *(undefined4 *)((long)&(pdVar1->dpds).z + lVar6 + lVar7) = 0;
          *(undefined8 *)((long)&(pdVar1->dpdt).x + lVar6 + lVar7) = 0;
          *(undefined4 *)((long)&(pdVar1->dpdt).z + lVar6 + lVar7) = 0x3f800000;
          lVar6 = lVar6 + 0x40;
        } while (uVar5 * 0x40 != lVar6);
      }
      uVar4 = uVar4 + 1;
      lVar7 = lVar7 + (long)(int)uVar2 * 0x40;
    } while (uVar4 != ring_segments + 2);
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_torus(
    float aspect, int ring_segments, int pipe_segments
) {
    djg_mesh *mesh = djgm_load_plane(ring_segments, pipe_segments);
    int i, j;

    ring_segments+= 2;
    pipe_segments+= 2;

    for (i = 0; i < ring_segments; ++i)
    for (j = 0; j < pipe_segments; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * pipe_segments + j];
        float a1 = v->st.s * 2 * M_PI;
        float a2 = v->st.t * 2 * M_PI;
        float tmp = 1 + aspect * cos(a1);
        float tx, ty, tn;

        v->p.x = tmp * cos(a2);
        v->p.y = tmp * sin(a2);
        v->p.z = aspect * sin(a1);

        // tangent (requires normalization)
        v->dpds.x = 0;
        v->dpds.y = 0;
        v->dpds.z = 0;

        // bitangent
        v->dpdt.x = 0;
        v->dpdt.y = 0;
        v->dpdt.z = 1;
    }

    return mesh;
}